

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smodels.cpp
# Opt level: O1

void __thiscall Potassco::SmodelsOutput::assume(SmodelsOutput *this,LitSpan *lits)

{
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  
  if (this->sec_ < 2) {
    iVar1 = this->sec_;
    while (iVar1 != 2) {
      std::ostream::operator<<((ostream *)this->os_,0);
      std::__ostream_insert<char,std::char_traits<char>>(this->os_,"\n",1);
      iVar1 = this->sec_ + 1;
      this->sec_ = iVar1;
    }
    std::__ostream_insert<char,std::char_traits<char>>(this->os_,"B+\n",3);
    if (lits->size != 0) {
      piVar3 = lits->first;
      do {
        if (0 < *piVar3) {
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)this->os_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
        }
        piVar3 = piVar3 + 1;
      } while (piVar3 != lits->first + lits->size);
    }
    std::__ostream_insert<char,std::char_traits<char>>(this->os_,"0\nB-\n",5);
    if (lits->size != 0) {
      piVar3 = lits->first;
      do {
        if (*piVar3 < 0) {
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)this->os_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
        }
        piVar3 = piVar3 + 1;
      } while (piVar3 != lits->first + lits->size);
    }
    if ((this->fHead_ != false) && (this->false_ != 0)) {
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)this->os_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(this->os_,"0\n",2);
    return;
  }
  fail(-2,"virtual void Potassco::SmodelsOutput::assume(const LitSpan &)",0x164,"sec_ < 2",
       "at most one compute statement supported in smodels format",0);
}

Assistant:

void SmodelsOutput::assume(const LitSpan& lits) {
	POTASSCO_REQUIRE(sec_ < 2, "at most one compute statement supported in smodels format");
	while (sec_ != 2) { startRule(End).endRule(); ++sec_; }
	os_ << "B+\n";
	for (const Lit_t* x = begin(lits); x != end(lits); ++x) {
		if (lit(*x) > 0) { os_ << atom(*x) << "\n"; }
	}
	os_ << "0\nB-\n";
	for (const Lit_t* x = begin(lits); x != end(lits); ++x) {
		if (lit(*x) < 0) { os_ << atom(*x) << "\n"; }
	}
	if (fHead_ && false_) {
		os_ << false_ << "\n";
	}
	os_ << "0\n";
}